

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JsonReporter::testCasePartialStarting
          (JsonReporter *this,TestCaseInfo *param_2,uint64_t index)

{
  JsonValueWriter *this_00;
  JsonReporter *in_RSI;
  unsigned_long *in_RDI;
  StringRef SVar1;
  size_type unaff_retaddr;
  JsonReporter *in_stack_fffffffffffffe40;
  size_t local_1b8;
  JsonObjectWriter local_1b0 [17];
  unsigned_long *puVar2;
  
  puVar2 = in_RDI;
  startObject(in_stack_fffffffffffffe40);
  this_00 = (JsonValueWriter *)
            std::
            stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
            ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                   *)0x1a4940);
  SVar1 = operator____sr((char *)this_00,(size_t)in_RDI);
  local_1b8 = SVar1.m_size;
  JsonObjectWriter::write(local_1b0,(int)this_00,SVar1.m_start,local_1b8);
  JsonValueWriter::write<unsigned_long>(this_00,in_RDI);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a499c);
  operator____sr((char *)this_00,(size_t)in_RDI);
  SVar1.m_size = unaff_retaddr;
  SVar1.m_start = (char *)puVar2;
  startArray(in_RSI,SVar1);
  return;
}

Assistant:

void JsonReporter::testCasePartialStarting( TestCaseInfo const& /*tcInfo*/,
                                                uint64_t index ) {
        startObject();
        m_objectWriters.top().write( "run-idx"_sr ).write( index );
        startArray( "path"_sr );
        // TODO: we want to delay most of the printing to the 'root' section
        // TODO: childSection key name?
    }